

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O0

void __thiscall Assimp::OptimizeMeshesProcess::~OptimizeMeshesProcess(OptimizeMeshesProcess *this)

{
  OptimizeMeshesProcess *this_local;
  
  ~OptimizeMeshesProcess(this);
  operator_delete(this);
  return;
}

Assistant:

OptimizeMeshesProcess::~OptimizeMeshesProcess() {
    // empty
}